

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.h
# Opt level: O0

void __thiscall Jupiter::HTTP::Server::Content::~Content(Content *this)

{
  Content *this_local;
  
  *(code **)this = RenX::Plugin::RenX_OnWeaponPurchase;
  std::__cxx11::string::~string((string *)(this + 0x18));
  return;
}

Assistant:

struct JUPITER_API Content
			{
				bool free_result = true;
				Jupiter::HTTP::Server::HTTPFunction *function; // function to generate content data
				std::string name; // name of the content
				unsigned int name_checksum; // name.calcChecksum()
				std::string_view language; // Pointer to a constant (or otherwise managed) string
				std::string_view type; // Pointer to a constant (or otherwise managed) string
				std::string_view charset; // Pointer to a constant (or otherwise managed) string

				virtual std::string* execute(std::string_view query_string);

				Content(std::string in_name, Jupiter::HTTP::Server::HTTPFunction in_function);
			}